

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

int __thiscall
duckdb_re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  iterator pIVar4;
  Thread **ppTVar5;
  char *pcVar6;
  ostream *poVar7;
  int __c;
  SparseArray<duckdb_re2::NFA::Thread_*> *in_RDX;
  SparseArray<duckdb_re2::NFA::Thread_*> *in_RSI;
  SparseArray<duckdb_re2::NFA::Thread_*> *t_00;
  NFA *in_RDI;
  char *in_R9;
  char *in_stack_00000070;
  StringPiece *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  Threadq *in_stack_00000088;
  NFA *in_stack_00000090;
  Thread *in_stack_000000a0;
  Inst *ip;
  int id;
  Thread *t;
  iterator i;
  SparseArray<duckdb_re2::NFA::Thread_*> *in_stack_fffffffffffffda8;
  Prog *in_stack_fffffffffffffdb0;
  LogMessage *in_stack_fffffffffffffdc0;
  iterator pIVar8;
  Prog *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  InstOp in_stack_fffffffffffffde4;
  LogMessage local_1d8;
  Inst *local_58;
  undefined4 local_4c;
  SparseArray<duckdb_re2::NFA::Thread_*> *local_48;
  iterator local_40;
  char *local_38;
  SparseArray<duckdb_re2::NFA::Thread_*> *local_18;
  
  local_38 = in_R9;
  local_18 = in_RSI;
  SparseArray<duckdb_re2::NFA::Thread_*>::clear(in_RDX);
  local_40 = SparseArray<duckdb_re2::NFA::Thread_*>::begin
                       ((SparseArray<duckdb_re2::NFA::Thread_*> *)0x831acd);
  do {
    pIVar8 = local_40;
    pIVar4 = SparseArray<duckdb_re2::NFA::Thread_*>::end
                       ((SparseArray<duckdb_re2::NFA::Thread_*> *)in_stack_fffffffffffffdb0);
    if (pIVar8 == pIVar4) {
      SparseArray<duckdb_re2::NFA::Thread_*>::clear(local_18);
      return 0;
    }
    ppTVar5 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::value(local_40);
    t_00 = (SparseArray<duckdb_re2::NFA::Thread_*> *)*ppTVar5;
    local_48 = t_00;
    if (t_00 != (SparseArray<duckdb_re2::NFA::Thread_*> *)0x0) {
      if ((((in_RDI->longest_ & 1U) == 0) || ((in_RDI->matched_ & 1U) == 0)) ||
         (**(char ***)
            &(t_00->sparse_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> <= *in_RDI->match_))
      {
        pcVar6 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::index
                           (local_40,(char *)in_RSI,__c);
        local_4c = SUB84(pcVar6,0);
        local_58 = Prog::inst(in_stack_fffffffffffffdb0,
                              (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        IVar2 = Prog::Inst::opcode(local_58);
        pIVar8 = local_40;
        if (IVar2 == kInstAltMatch) {
          pIVar4 = SparseArray<duckdb_re2::NFA::Thread_*>::begin
                             ((SparseArray<duckdb_re2::NFA::Thread_*> *)0x831d09);
          if ((pIVar8 == pIVar4) &&
             ((bVar1 = Prog::Inst::greedy((Inst *)CONCAT44(in_stack_fffffffffffffde4,
                                                           in_stack_fffffffffffffde0),
                                          in_stack_fffffffffffffdd8), bVar1 ||
              ((in_RDI->longest_ & 1U) != 0)))) {
            CopyCapture((NFA *)in_stack_fffffffffffffdb0,(char **)in_stack_fffffffffffffda8,
                        (char **)0x831d60);
            in_RDI->matched_ = true;
            Decref(in_RDI,(Thread *)local_48);
            while( true ) {
              local_40 = local_40 + 1;
              pIVar8 = local_40;
              pIVar4 = SparseArray<duckdb_re2::NFA::Thread_*>::end
                                 ((SparseArray<duckdb_re2::NFA::Thread_*> *)
                                  in_stack_fffffffffffffdb0);
              if (pIVar8 == pIVar4) break;
              ppTVar5 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::value(local_40);
              if (*ppTVar5 != (Thread *)0x0) {
                ppTVar5 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::value(local_40);
                Decref(in_RDI,*ppTVar5);
              }
            }
            SparseArray<duckdb_re2::NFA::Thread_*>::clear(local_18);
            bVar1 = Prog::Inst::greedy((Inst *)CONCAT44(in_stack_fffffffffffffde4,
                                                        in_stack_fffffffffffffde0),
                                       in_stack_fffffffffffffdd8);
            if (!bVar1) {
              iVar3 = Prog::Inst::out(local_58);
              return iVar3;
            }
            iVar3 = Prog::Inst::out1(local_58);
            return iVar3;
          }
        }
        else if (IVar2 == kInstByteRange) {
          Prog::Inst::out(local_58);
          in_stack_fffffffffffffda8 = local_48;
          AddToThreadq(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000080,
                       in_stack_00000078,in_stack_00000070,in_stack_000000a0);
        }
        else if (IVar2 == kInstMatch) {
          if (local_38 == (char *)0x0) {
            CopyCapture((NFA *)in_stack_fffffffffffffdb0,(char **)in_stack_fffffffffffffda8,
                        (char **)0x831e80);
            in_RDI->match_[1] = local_38;
            in_RDI->matched_ = true;
          }
          else if (((in_RDI->endmatch_ & 1U) == 0) || (local_38 + -1 == in_RDI->etext_)) {
            if ((in_RDI->longest_ & 1U) == 0) {
              CopyCapture((NFA *)in_stack_fffffffffffffdb0,(char **)in_stack_fffffffffffffda8,
                          (char **)0x831fa8);
              in_RDI->match_[1] = local_38 + -1;
              in_RDI->matched_ = true;
              Decref(in_RDI,(Thread *)local_48);
              while( true ) {
                local_40 = local_40 + 1;
                pIVar8 = local_40;
                pIVar4 = SparseArray<duckdb_re2::NFA::Thread_*>::end
                                   ((SparseArray<duckdb_re2::NFA::Thread_*> *)
                                    in_stack_fffffffffffffdb0);
                if (pIVar8 == pIVar4) break;
                ppTVar5 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::value(local_40);
                if (*ppTVar5 != (Thread *)0x0) {
                  ppTVar5 = SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue::value(local_40);
                  Decref(in_RDI,*ppTVar5);
                }
              }
              SparseArray<duckdb_re2::NFA::Thread_*>::clear(local_18);
              return 0;
            }
            if ((((in_RDI->matched_ & 1U) == 0) ||
                (**(char ***)
                   &(local_48->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> <
                 *in_RDI->match_)) ||
               ((**(char ***)
                   &(local_48->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> ==
                 *in_RDI->match_ && (in_RDI->match_[1] < local_38 + -1)))) {
              CopyCapture((NFA *)in_stack_fffffffffffffdb0,(char **)in_stack_fffffffffffffda8,
                          (char **)0x831f63);
              in_RDI->match_[1] = local_38 + -1;
              in_RDI->matched_ = true;
            }
          }
        }
        else {
          LogMessage::LogMessage
                    ((LogMessage *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,0);
          poVar7 = LogMessage::stream(&local_1d8);
          poVar7 = std::operator<<(poVar7,"Unhandled ");
          in_stack_fffffffffffffde4 = Prog::Inst::opcode(local_58);
          in_stack_fffffffffffffdd8 =
               (Prog *)std::ostream::operator<<(poVar7,in_stack_fffffffffffffde4);
          std::operator<<((ostream *)in_stack_fffffffffffffdd8," in step");
          LogMessage::~LogMessage(in_stack_fffffffffffffdc0);
        }
        in_RSI = local_48;
        Decref(in_RDI,(Thread *)local_48);
      }
      else {
        Decref(in_RDI,(Thread *)t_00);
        in_RSI = t_00;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior (arithmetic on a null pointer)
        // by storing p instead of p-1. (What would the latter even mean?!)
        // This complements the special case in NFA::Search().
        if (p == NULL) {
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;
          break;
        }

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}